

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WriteGeometryLibrary(ColladaExporter *this)

{
  ostream *poVar1;
  ulong local_18;
  size_t a;
  ColladaExporter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<library_geometries>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  for (local_18 = 0; local_18 < this->mScene->mNumMeshes; local_18 = local_18 + 1) {
    WriteGeometry(this,local_18);
  }
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</library_geometries>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WriteGeometryLibrary()
{
    mOutput << startstr << "<library_geometries>" << endstr;
    PushTag();

    for( size_t a = 0; a < mScene->mNumMeshes; ++a)
        WriteGeometry( a);

    PopTag();
    mOutput << startstr << "</library_geometries>" << endstr;
}